

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O3

word If_Dec5Perform(word t,int fDerive)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint *puVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  int Pla2Var [7];
  word D2 [4];
  word D;
  word C;
  word C2 [4];
  int Var2Pla [7];
  undefined8 local_120;
  uint local_118 [10];
  ulong local_f0;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong auStack_d0 [2];
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90 [2];
  ulong local_80;
  ulong local_78;
  ulong local_70;
  word local_68;
  word local_60;
  uint auStack_58 [10];
  
  lVar1 = 0;
  do {
    auStack_58[lVar1] = (uint)lVar1;
    local_118[lVar1] = (uint)lVar1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  uVar3 = 0;
  uVar15 = t;
  do {
    uVar19 = auStack_58[uVar3];
    local_120 = t;
    if ((int)uVar19 < 0) {
      __assert_fail("Var2Pla[v] >= p",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                    ,0xf0,"word If_Dec6MoveTo(word, int, int, int *, int *)");
    }
    while (uVar19 != 0) {
      if (5 < (int)uVar19) {
        __assert_fail("v < 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                      ,0xea,"word If_Dec6SwapAdjacent(word, int)");
      }
      lVar1 = (long)(int)uVar19;
      bVar4 = (byte)(1 << ((char)uVar19 - 1U & 0x1f));
      uVar15 = (uVar15 & PMasks[lVar1 + -1][2]) >> (bVar4 & 0x3f) |
               (PMasks[lVar1 + -1][1] & uVar15) << (bVar4 & 0x3f) | PMasks[lVar1 + -1][0] & uVar15;
      uVar19 = *(uint *)((long)&local_120 + lVar1 * 4 + 4);
      auStack_58[(int)uVar19] = auStack_58[(int)uVar19] + 1;
      uVar14 = local_118[lVar1];
      auStack_58[(int)uVar14] = auStack_58[(int)uVar14] - 1;
      local_118[lVar1] = uVar19;
      *(uint *)((long)&local_120 + lVar1 * 4 + 4) = uVar14;
      uVar19 = auStack_58[uVar3];
    }
    if (uVar3 != local_118[0]) {
      __assert_fail("Pla2Var[p] == v",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                    ,0xfc,"word If_Dec6MoveTo(word, int, int, int *, int *)");
    }
    local_c0 = uVar3;
    uVar2 = 0;
    do {
      if (uVar2 != local_118[(int)auStack_58[uVar2]]) {
        __assert_fail("Pla2Var[Var2Pla[i]] == i",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                      ,0x1a2,"void If_DecVerifyPerm(int *, int *)");
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != 6);
    uVar2 = 0;
    do {
      uVar19 = (uint)uVar2;
      uVar9 = uVar19 + 1;
      uVar18 = uVar2;
      uVar14 = uVar9;
      if (uVar19 < 3) {
        do {
          local_60 = t;
          uVar6 = 0;
          while( true ) {
            uVar20 = 0;
            lVar1 = 0;
            uVar17 = 0;
            do {
              bVar4 = (byte)uVar2;
              if ((((uVar20 >> (bVar4 & 0x1f) ^ (uint)uVar6) & 1) == 0) &&
                 ((uint)((uVar20 >> (uVar14 & 0x1f) & 1) != 0) == (uint)(uVar6 >> 1))) {
                uVar17 = uVar17 | 1 << ((byte)(uVar15 >> ((byte)lVar1 & 0x3f)) & 3);
              }
              lVar1 = lVar1 + 2;
              uVar20 = uVar20 + 1;
            } while (lVar1 != 0x20);
            if (2 < BitCount8[uVar17 & 0xf]) break;
            uVar17 = (uint)uVar6 + 1;
            uVar6 = (ulong)uVar17;
            if (uVar17 == 4) {
              if (fDerive == 0) {
                return 1;
              }
              local_d8 = 0;
              auStack_d0[0] = 0;
              local_e8 = 0;
              uStack_e0 = 0;
              uVar9 = 0;
              goto LAB_00391ee4;
            }
          }
          uVar14 = uVar14 + 1;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (uVar14 != 4);
      }
      uVar2 = (ulong)uVar9;
    } while (uVar9 != 4);
    uVar3 = uVar3 + 1;
    if (uVar3 == 5) {
      return 0;
    }
  } while( true );
  while (uVar9 = uVar9 + 1, uVar9 != 4) {
LAB_00391ee4:
    if (uVar19 != uVar9 && uVar14 != uVar9) goto LAB_00391eff;
  }
  uVar9 = 0xffffffff;
LAB_00391eff:
  uVar17 = 1;
  puVar16 = local_118 + 2;
  while( true ) {
    iVar11 = (int)uVar18;
    uVar18 = (ulong)(iVar11 - 1);
    if (((uVar9 != uVar17) && (uVar19 != uVar17)) && (iVar11 != 0)) break;
    uVar17 = uVar17 + 1;
    puVar16 = puVar16 + 1;
    if (uVar17 == 4) {
LAB_00391f26:
      __assert_fail("zz1 != -1 && zz2 != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                    ,0x2d0,"word If_Dec5CofCount2(word, int, int, int *, word, int)");
    }
  }
  if (uVar9 != 0xffffffff) {
    uVar18 = 0;
    do {
      uVar19 = (uint)(uVar18 >> 1) & 0x7fffffff;
      uVar20 = 0;
      lVar1 = 0;
      uVar6 = 0;
      do {
        if ((((uVar20 >> (bVar4 & 0x1f) ^ (uint)uVar18) & 1) == 0) &&
           (((uVar20 >> (uVar14 & 0x1f) & 1) != 0) == uVar19)) {
          uVar6 = (ulong)((uint)uVar6 | 1 << ((byte)(uVar15 >> ((byte)lVar1 & 0x3f)) & 3));
        }
        uVar10 = (uint)uVar6;
        lVar1 = lVar1 + 2;
        uVar20 = uVar20 + 1;
      } while (lVar1 != 0x20);
      sVar7 = (short)uVar6;
      if (BitCount8[uVar10 & 0xf] == 2) {
        if (uVar10 == 0) {
          iVar11 = -1;
        }
        else {
          uVar12 = uVar6;
          if (sVar7 == 0) {
            uVar12 = 0;
          }
          iVar5 = (uint)(sVar7 == 0) * 0x10;
          if ((char)uVar12 == '\0') {
            uVar12 = 0;
            iVar5 = iVar5 + 8;
          }
          if ((uVar12 & 0xf) == 0) {
            uVar12 = 0;
            iVar5 = iVar5 + 4;
          }
          uVar20 = (uint)(uVar12 >> 2);
          iVar11 = iVar5 + 2;
          if ((uVar12 & 3) != 0) {
            uVar20 = (uint)uVar12;
            iVar11 = iVar5;
          }
          iVar11 = (~uVar20 & 1) + iVar11;
        }
        uVar13 = 1L << ((byte)iVar11 & 0x3f);
        uVar12 = 0xffffffffffffffff;
        if (uVar13 != uVar6) {
          bVar21 = (int)(uVar6 ^ uVar13) == 0;
          uVar12 = uVar13 >> 0x20;
          if (!bVar21) {
            uVar12 = uVar6 ^ uVar13;
          }
          iVar8 = (uint)bVar21 * 0x20;
          iVar5 = iVar8 + 0x10;
          uVar6 = uVar12 >> 0x10;
          if ((short)uVar12 != 0) {
            iVar5 = iVar8;
            uVar6 = uVar12;
          }
          iVar8 = iVar5 + 8;
          uVar12 = uVar6 >> 8;
          if ((char)uVar6 != '\0') {
            iVar8 = iVar5;
            uVar12 = uVar6;
          }
          iVar5 = iVar8 + 4;
          uVar6 = uVar12 >> 4;
          if ((uVar12 & 0xf) != 0) {
            iVar5 = iVar8;
            uVar6 = uVar12;
          }
          uVar20 = (uint)(uVar6 >> 2) & 0x3fffffff;
          iVar8 = iVar5 + 2;
          if ((uVar6 & 3) != 0) {
            uVar20 = (uint)uVar6;
            iVar8 = iVar5;
          }
          uVar12 = (ulong)((~uVar20 & 1) + iVar8);
        }
        (&local_a8)[uVar18] =
             *(ulong *)(&DAT_008aa720 + (long)iVar11 * 8) & 0x3333333333333333 |
             *(ulong *)(&DAT_008aa720 + uVar12 * 8) & 0xcccccccccccccccc;
        uVar20 = 0;
        lVar1 = 0;
        do {
          if (((((uVar20 >> (bVar4 & 0x1f) ^ (uint)uVar18) & 1) == 0) &&
              (((uVar20 >> (uVar14 & 0x1f) & 1) != 0) == uVar19)) &&
             (((uint)(uVar15 >> ((byte)lVar1 & 0x3f)) & 3) == uVar12)) {
            (&local_e8)[uVar18] =
                 (&local_e8)[uVar18] |
                 1L << ((uVar20 >> (uVar9 & 0x1f) & 1) != 0) +
                       ((byte)(uVar20 >> ((byte)uVar17 & 0x1f)) & 1) * '\x02';
          }
          lVar1 = lVar1 + 2;
          uVar20 = uVar20 + 1;
        } while (lVar1 != 0x20);
        uVar6 = (ulong)((uint)(&local_e8)[uVar18] & 0xf) * 0x1111111111111111;
      }
      else {
        if (BitCount8[uVar10 & 0xf] != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                        ,0x2e9,"word If_Dec5CofCount2(word, int, int, int *, word, int)");
        }
        uVar6 = 0xffffffffffffffff;
        uVar12 = 0xffffffffffffffff;
        if (uVar10 != 0) {
          if (sVar7 == 0) {
            uVar10 = 0;
          }
          iVar11 = (uint)(sVar7 == 0) * 0x10;
          if ((char)uVar10 == '\0') {
            uVar10 = 0;
            iVar11 = iVar11 + 8;
          }
          if ((uVar10 & 0xf) == 0) {
            uVar10 = 0;
            iVar11 = iVar11 + 4;
          }
          uVar19 = uVar10 >> 2;
          iVar5 = iVar11 + 2;
          if ((uVar10 & 3) != 0) {
            uVar19 = uVar10;
            iVar5 = iVar11;
          }
          uVar12 = (ulong)((~uVar19 & 1) + iVar5);
        }
        (&local_a8)[uVar18] = *(ulong *)(&DAT_008aa720 + uVar12 * 8);
      }
      (&local_e8)[uVar18] = uVar6;
      uVar18 = uVar18 + 1;
    } while (uVar18 != 4);
    local_80 = local_a0 & 0xf000f000f000f0;
    local_70 = local_a8 & 0xf000f000f000f;
    local_f0 = local_70 + local_80;
    local_78 = local_90[0] & 0xf000f000f000f000;
    uVar12 = local_98 & 0xf000f000f000f00 | local_78;
    local_b0 = uVar12 + local_f0;
    uVar15 = (local_e8 & 0xf000f000f000f) + (uStack_e0 & 0xf000f000f000f0);
    uVar18 = local_d8 & 0xf000f000f000f00 | auStack_d0[0] & 0xf000f000f000f000;
    local_b8 = uVar18 + uVar15;
    uVar6 = local_b8 >> 4 ^ local_b8;
    uVar18 = uVar18 >> 8;
    if (((uVar6 & 0xf0f0f0f0f0f0f0f) == 0) || (uVar18 == uVar15)) {
      bVar21 = (uVar6 & 0xf0f0f0f0f0f0f0f) == 0;
      if ((bVar21) || (uVar18 != uVar15)) {
        if (!bVar21 || uVar18 == uVar15) {
          uVar15 = (long)(int)*puVar16 << 0x14 |
                   (long)(int)local_118[(long)(int)uVar9 + 1] << 0x10 | local_b8 & 0xffff |
                   0x66000000;
          goto LAB_00392393;
        }
        local_b8 = (uStack_e0 & 0xf000f000f000f0) << 4 | local_e8 & 0xf000f000f000f |
                   auStack_d0[0] & 0xf000f000f000f000 | local_b8 >> 4 & 0xf000f000f000f0;
        uVar18 = (long)(int)local_118[(long)(int)uVar9 + 1] << 0x10 | local_b8 & 0xffff;
        uVar19 = *puVar16;
        uVar15 = (ulong)uVar14;
      }
      else {
        uVar18 = (long)(int)local_118[(long)(int)uVar9 + 1] << 0x10 | local_b8 & 0xffff;
        uVar19 = *puVar16;
        uVar15 = uVar2;
      }
      uVar15 = (long)(int)local_118[uVar15 + 1] << 0x18 | (long)(int)uVar19 << 0x14 | uVar18 |
               0x60000000;
    }
    else {
      uVar15 = (long)(int)local_118[(ulong)uVar14 + 1] << 0x1c |
               (long)(int)local_118[uVar2 + 1] << 0x18 | (long)(int)*puVar16 << 0x14 |
               (long)(int)local_118[(long)(int)uVar9 + 1] << 0x10 | local_b8 & 0xffff;
    }
LAB_00392393:
    uVar18 = local_b0 >> 4 ^ local_b0;
    uVar12 = uVar12 >> 8;
    if (((uVar18 & 0xf0f0f0f0f0f0f0f) == 0) || (uVar12 == local_f0)) {
      bVar21 = (uVar18 & 0xf0f0f0f0f0f0f0f) == 0;
      if ((bVar21) || (uVar12 != local_f0)) {
        if (!bVar21 || uVar12 == local_f0) {
          uVar3 = uVar3 << 0x30 | (local_b0 & 0xffff) << 0x20;
          uVar18 = 0x6670000000000000;
          goto LAB_003924b2;
        }
        local_b0 = local_80 << 4 | local_70 | local_78 | local_b0 >> 4 & 0xf000f000f000f0;
        uVar3 = uVar3 << 0x30 | (local_b0 & 0xffff) << 0x20;
        uVar2 = (ulong)uVar14;
      }
      else {
        uVar3 = uVar3 << 0x30 | (local_b0 & 0xffff) << 0x20;
      }
      uVar18 = 0x6070000000000000;
      uVar3 = (ulong)local_118[uVar2 + 1] << 0x38 | uVar3;
    }
    else {
      uVar3 = (ulong)local_118[(ulong)uVar14 + 1] << 0x3c | (ulong)local_118[uVar2 + 1] << 0x38 |
              uVar3 << 0x30 | (local_b0 & 0xffff) << 0x20;
      uVar18 = 0x70000000000000;
    }
LAB_003924b2:
    uVar3 = uVar15 | uVar18 | uVar3;
    local_68 = If_Dec6Truth(uVar3);
    if (local_68 == t) {
      return uVar3;
    }
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&local_a8,5);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&local_a0,5);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&local_98,5);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)local_90,5);
    putchar(10);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&local_e8,5);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&uStack_e0,5);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&local_d8,5);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)auStack_d0,5);
    putchar(10);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&local_b0,5);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&local_b8,5);
    putchar(10);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&local_68,5);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&local_60,5);
    putchar(10);
    if (local_68 == local_60) {
      return uVar3;
    }
    __assert_fail("t1 == t0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                  ,0x35f,"word If_Dec5CofCount2(word, int, int, int *, word, int)");
  }
  goto LAB_00391f26;
}

Assistant:

word If_Dec5Perform( word t, int fDerive )
{
    int Pla2Var[7], Var2Pla[7];
    int i, j, v;
    word t0 = t;
/*
    word c0, c1, c00, c01, c10, c11;
    for ( i = 0; i < 5; i++ )
    {
        c0 = If_Dec6Cofactor( t, i, 0 );
        c1 = If_Dec6Cofactor( t, i, 1 );
        if ( c0 == 0 )
            return 1;
        if ( ~c0 == 0 )
            return 1;
        if ( c1 == 0 )
            return 1;
        if ( ~c1 == 0 )
            return 1;
       if ( c0 == ~c1 )
            return 1;
    }
    for ( i = 0; i < 4; i++ )
    {
        c0 = If_Dec6Cofactor( t, i, 0 );
        c1 = If_Dec6Cofactor( t, i, 1 );
        for ( j = i + 1; j < 5; j++ )
        {
            c00 = If_Dec6Cofactor( c0, j, 0 );
            c01 = If_Dec6Cofactor( c0, j, 1 );
            c10 = If_Dec6Cofactor( c1, j, 0 );
            c11 = If_Dec6Cofactor( c1, j, 1 );
            if ( c00 == c01 && c00 == c10 )
                return 1;
            if ( c11 == c01 && c11 == c10 )
                return 1;
            if ( c11 == c00 && c11 == c01 )
                return 1;
            if ( c11 == c00 && c11 == c10 )
                return 1;
            if ( c00 == c11 && c01 == c10 )
                return 1;
        }
    }
*/
    // start arrays
    for ( i = 0; i < 7; i++ )
        Pla2Var[i] = Var2Pla[i] = i;
    // generate permutations
    for ( v = 0; v < 5; v++ )
    {
        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla );
        for ( i = 0; i < 4; i++ )
            for ( j = i + 1; j < 4; j++ )
            {
                word z = If_Dec5CofCount2( t, i, j, Pla2Var, t0, fDerive );
                if ( z )
                {
/*
                    if ( v == 0 && i == 1 && j == 2 )
                    {
                          Kit_DsdPrintFromTruth( (unsigned *)&t, 5 ); printf( "\n" );
                    }
*/
                    return z;
                }
            }
    }

/*
    // start arrays
    for ( i = 0; i < 7; i++ )
        Pla2Var[i] = Var2Pla[i] = i;

    t = t0;
    for ( v = 0; v < 5; v++ )
    {
        int x, y;

        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla );

        for ( i = 0; i < 16; i++ )
            printf( "%d ", ((t >> (i<<1)) & 3) );
        printf( "\n" );

        for ( x = 0; x < 4; x++ )
        for ( y = x + 1; y < 4; y++ )
        {
            for ( i = 0; i < 16; i++ )
                if ( !((i >> x) & 1) && !((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( ((i >> x) & 1) && !((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( !((i >> x) & 1) && ((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( ((i >> x) & 1) && ((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );
            printf( "\n" );
        }
    }
*/

//    Kit_DsdPrintFromTruth( (unsigned *)&t, 5 ); printf( "\n" );
    return 0;
}